

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_generator.cc
# Opt level: O0

void webrtc::WindowGenerator::KaiserBesselDerived(float alpha,size_t length,float *window)

{
  ostream *poVar1;
  float *pfVar2;
  complex<float> x;
  float fVar3;
  float local_3cc;
  float local_3c4;
  float *local_390;
  size_t i_1;
  float local_380;
  complex<float> local_37c;
  complex<float> local_374;
  float local_36c [3];
  complex<float> local_360;
  complex<float> local_358;
  complex<float> r;
  size_t i;
  float sum;
  size_t half;
  FatalMessage local_330;
  FatalMessageVoidify local_1b5 [13];
  FatalMessage local_1a8;
  uint local_2c;
  string *local_28;
  string *_result;
  float *window_local;
  size_t length_local;
  float alpha_local;
  
  local_2c = 1;
  _result = (string *)window;
  window_local = (float *)length;
  length_local._4_4_ = alpha;
  local_28 = rtc::CheckGTImpl<unsigned_long,unsigned_int>
                       ((unsigned_long *)&window_local,&local_2c,"length > 1U");
  if (local_28 != (string *)0x0) {
    rtc::FatalMessage::FatalMessage
              (&local_1a8,
               "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/common_audio/window_generator.cc"
               ,0x33,local_28);
    rtc::FatalMessage::stream(&local_1a8);
    rtc::FatalMessage::~FatalMessage(&local_1a8);
  }
  if (_result != (string *)0x0) {
    pfVar2 = (float *)((long)window_local + 1U >> 1);
    i._4_4_ = 0.0;
    local_28 = (string *)0x0;
    for (r._M_value = 0; local_390 = window_local, r._M_value <= pfVar2; r._M_value = r._M_value + 1
        ) {
      local_3c4 = (float)r._M_value;
      local_3cc = (float)window_local;
      std::complex<float>::complex(&local_358,(local_3c4 * 4.0) / local_3cc + -1.0,0.0);
      local_36c[0] = length_local._4_4_ * 3.1415927;
      local_380 = 1.0;
      std::operator*(&local_358,&local_358);
      std::operator-(&local_380,(complex<float> *)&i_1);
      std::sqrt<float>(&local_37c);
      x._M_value = (_ComplexT)local_36c;
      std::operator*((float *)x._M_value,&local_374);
      anon_unknown.dwarf_7270e::I0(x);
      fVar3 = std::complex<float>::real_abi_cxx11_(&local_360);
      i._4_4_ = fVar3 + i._4_4_;
      *(float *)(_result + r._M_value * 4) = i._4_4_;
    }
    while (local_390 = (float *)((long)local_390 - 1), pfVar2 <= local_390) {
      fVar3 = sqrtf(*(float *)(_result + ((long)window_local + (-1 - (long)local_390)) * 4) /
                    i._4_4_);
      *(float *)(_result + ((long)window_local + (-1 - (long)local_390)) * 4) = fVar3;
      *(undefined4 *)(_result + (long)local_390 * 4) =
           *(undefined4 *)(_result + ((long)window_local + (-1 - (long)local_390)) * 4);
    }
    if (((ulong)window_local & 1) == 1) {
      fVar3 = sqrtf(*(float *)(_result + ((long)pfVar2 - 1U) * 4) / i._4_4_);
      *(float *)(_result + ((long)pfVar2 - 1U) * 4) = fVar3;
    }
    return;
  }
  rtc::FatalMessageVoidify::FatalMessageVoidify(local_1b5);
  rtc::FatalMessage::FatalMessage
            (&local_330,
             "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/common_audio/window_generator.cc"
             ,0x34);
  poVar1 = rtc::FatalMessage::stream(&local_330);
  poVar1 = std::operator<<(poVar1,"Check failed: window != nullptr");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(poVar1,"# ");
  rtc::FatalMessageVoidify::operator&(local_1b5,poVar1);
  rtc::FatalMessage::~FatalMessage(&local_330);
}

Assistant:

void WindowGenerator::KaiserBesselDerived(float alpha, size_t length,
                                          float* window) {
  RTC_CHECK_GT(length, 1U);
  RTC_CHECK(window != nullptr);

  const size_t half = (length + 1) / 2;
  float sum = 0.0f;

  for (size_t i = 0; i <= half; ++i) {
    complex<float> r = (4.0f * i) / length - 1.0f;
    sum += I0(static_cast<float>(M_PI) * alpha * sqrt(1.0f - r * r)).real();
    window[i] = sum;
  }
  for (size_t i = length - 1; i >= half; --i) {
    window[length - i - 1] = sqrtf(window[length - i - 1] / sum);
    window[i] = window[length - i - 1];
  }
  if (length % 2 == 1) {
    window[half - 1] = sqrtf(window[half - 1] / sum);
  }
}